

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afglobal.c
# Opt level: O0

FT_Error af_face_globals_new(FT_Face face,AF_FaceGlobals *aglobals,AF_Module module)

{
  hb_font_t *phVar1;
  hb_buffer_t *phVar2;
  AF_FaceGlobals local_38;
  AF_FaceGlobals globals;
  FT_Memory memory;
  AF_Module pAStack_20;
  FT_Error error;
  AF_Module module_local;
  AF_FaceGlobals *aglobals_local;
  FT_Face face_local;
  
  pAStack_20 = module;
  module_local = (AF_Module)aglobals;
  aglobals_local = (AF_FaceGlobals *)face;
  local_38 = (AF_FaceGlobals)
             ft_mem_alloc(face->memory,face->num_glyphs * 2 + 0x308,(FT_Error *)((long)&memory + 4))
  ;
  if (memory._4_4_ == 0) {
    local_38->face = (FT_Face)aglobals_local;
    local_38->glyph_count = (FT_Long)aglobals_local[4];
    local_38->glyph_styles = (FT_UShort *)(local_38 + 1);
    local_38->module = pAStack_20;
    local_38->stem_darkening_for_ppem = 0;
    local_38->darken_x = 0;
    local_38->darken_y = 0;
    local_38->standard_vertical_width = 0;
    local_38->standard_horizontal_width = 0;
    local_38->scale_down_factor = 0;
    phVar1 = (hb_font_t *)hb_ft_font_create(aglobals_local,0);
    local_38->hb_font = phVar1;
    phVar2 = (hb_buffer_t *)hb_buffer_create();
    local_38->hb_buf = phVar2;
    memory._4_4_ = af_face_globals_compute_style_coverage(local_38);
    if (memory._4_4_ == 0) {
      local_38->increase_x_height = 0;
    }
    else {
      af_face_globals_free(local_38);
      local_38 = (AF_FaceGlobals)0x0;
    }
  }
  (module_local->root).clazz = (FT_Module_Class *)local_38;
  return memory._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_face_globals_new( FT_Face          face,
                       AF_FaceGlobals  *aglobals,
                       AF_Module        module )
  {
    FT_Error        error;
    FT_Memory       memory;
    AF_FaceGlobals  globals = NULL;


    memory = face->memory;

    /* we allocate an AF_FaceGlobals structure together */
    /* with the glyph_styles array                      */
    if ( FT_ALLOC( globals,
                   sizeof ( *globals ) +
                     (FT_ULong)face->num_glyphs * sizeof ( FT_UShort ) ) )
      goto Exit;

    globals->face                      = face;
    globals->glyph_count               = face->num_glyphs;
    /* right after the globals structure come the glyph styles */
    globals->glyph_styles              = (FT_UShort*)( globals + 1 );
    globals->module                    = module;
    globals->stem_darkening_for_ppem   = 0;
    globals->darken_x                  = 0;
    globals->darken_y                  = 0;
    globals->standard_vertical_width   = 0;
    globals->standard_horizontal_width = 0;
    globals->scale_down_factor         = 0;

#ifdef FT_CONFIG_OPTION_USE_HARFBUZZ
    globals->hb_font = hb_ft_font_create( face, NULL );
    globals->hb_buf  = hb_buffer_create();
#endif

    error = af_face_globals_compute_style_coverage( globals );
    if ( error )
    {
      af_face_globals_free( globals );
      globals = NULL;
    }
    else
      globals->increase_x_height = AF_PROP_INCREASE_X_HEIGHT_MAX;

  Exit:
    *aglobals = globals;
    return error;
  }